

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O3

void charls::transform_line<charls::transform_hp2<unsigned_short>::inverse,unsigned_short>
               (triplet<unsigned_short> *destination,triplet<unsigned_short> *source,
               size_t pixel_count,inverse *transform)

{
  ushort uVar1;
  long lVar2;
  uint uVar3;
  
  if (pixel_count != 0) {
    lVar2 = 0;
    do {
      uVar1 = *(ushort *)((long)&source->field_1 + lVar2);
      uVar3 = (ushort)(*(short *)((long)&source->field_0 + lVar2) + uVar1) ^ 0x8000;
      *(ushort *)((long)&destination->field_2 + lVar2) =
           (short)(uVar3 + uVar1 >> 1) + *(short *)((long)&source->field_2 + lVar2) ^ 0x8000;
      *(uint *)((long)&destination->field_0 + lVar2) = uVar3 | (uint)uVar1 << 0x10;
      lVar2 = lVar2 + 6;
      pixel_count = pixel_count - 1;
    } while (pixel_count != 0);
  }
  return;
}

Assistant:

void transform_line(triplet<PixelType>* destination, const triplet<PixelType>* source, const size_t pixel_count,
                    Transform& transform) noexcept
{
    for (size_t i{}; i < pixel_count; ++i)
    {
        destination[i] = transform(source[i].v1, source[i].v2, source[i].v3);
    }
}